

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O3

uint64_t GetMicrosecondTimeCounter(void)

{
  timezone cateq_z;
  timeval cateq_v;
  timezone local_20;
  timeval local_18;
  
  gettimeofday(&local_18,&local_20);
  return local_18.tv_sec * 1000000 + local_18.tv_usec;
}

Assistant:

uint64_t GetMicrosecondTimeCounter()
{
#if defined(CAT_OS_WINDOWS)
    LARGE_INTEGER tim; // 64-bit! ieee
    QueryPerformanceCounter(&tim);
    return tim.QuadPart;
#elif defined(CAT_OS_ANDROID)
    struct timespec now;
    clock_gettime(CLOCK_MONOTONIC, &now);
    return (uint64_t)now.tv_sec * 1000000000ULL + now.tv_nsec);
#else
    struct timeval cateq_v;
    struct timezone cateq_z;
    gettimeofday(&cateq_v, &cateq_z);
    return (uint64_t)cateq_v.tv_sec * 1000000ULL + cateq_v.tv_usec;
#endif
}